

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

void __thiscall CLI::Success::Success(Success *this,string *msg,ExitCodes exit_code)

{
  string local_78;
  allocator local_41;
  string local_40;
  ExitCodes local_1c;
  string *psStack_18;
  ExitCodes exit_code_local;
  string *msg_local;
  Success *this_local;
  
  local_1c = exit_code;
  psStack_18 = msg;
  msg_local = (string *)this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_40,"Success",&local_41);
  ::std::__cxx11::string::string((string *)&local_78,(string *)msg);
  ParseError::ParseError(&this->super_ParseError,&local_40,&local_78,local_1c);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_41);
  *(undefined ***)&(this->super_ParseError).super_Error = &PTR__Success_001da020;
  return;
}

Assistant:

Success() : Success("Successfully completed, should be caught and quit", ExitCodes::Success) {}